

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-connect-multiple.c
# Opt level: O3

int run_test_pipe_connect_multiple(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  int iVar4;
  client_t *pcVar5;
  uv_pipe_t *puVar6;
  uv_pipe_t *puVar7;
  uv_loop_t *puVar8;
  long lVar9;
  client_t *pcVar10;
  
  puVar2 = (uv_loop_t *)uv_default_loop();
  iVar4 = 0x30eec0;
  puVar7 = (uv_pipe_t *)puVar2;
  iVar1 = uv_pipe_init(puVar2,&server_handle,0);
  if (iVar1 == 0) {
    puVar7 = &server_handle;
    iVar4 = 0x17e322;
    iVar1 = uv_pipe_bind();
    if (iVar1 != 0) goto LAB_00165384;
    puVar7 = &server_handle;
    iVar4 = 0x80;
    iVar1 = uv_listen(&server_handle,0x80,connection_cb);
    if (iVar1 != 0) goto LAB_00165389;
    pcVar10 = clients;
    lVar9 = 4;
    do {
      pcVar5 = pcVar10;
      puVar7 = (uv_pipe_t *)puVar2;
      iVar1 = uv_pipe_init(puVar2,pcVar10,0);
      iVar4 = (int)pcVar5;
      if (iVar1 != 0) {
        run_test_pipe_connect_multiple_cold_4();
        goto LAB_0016537f;
      }
      uv_pipe_connect(&pcVar10->conn_req,pcVar10,"/tmp/uv-test-sock",connect_cb);
      pcVar10 = pcVar10 + 1;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
    iVar4 = 0;
    uv_run();
    if (connection_cb_called != 4) goto LAB_0016538e;
    if (connect_cb_called != 4) goto LAB_00165393;
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    iVar4 = 0;
    uv_run(uVar3);
    puVar2 = (uv_loop_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
LAB_0016537f:
    run_test_pipe_connect_multiple_cold_1();
LAB_00165384:
    run_test_pipe_connect_multiple_cold_2();
LAB_00165389:
    puVar2 = (uv_loop_t *)puVar7;
    run_test_pipe_connect_multiple_cold_3();
LAB_0016538e:
    run_test_pipe_connect_multiple_cold_5();
LAB_00165393:
    run_test_pipe_connect_multiple_cold_6();
  }
  run_test_pipe_connect_multiple_cold_7();
  if (iVar4 == 0) {
    puVar6 = connections + connection_cb_called;
    puVar8 = *(uv_loop_t **)&puVar2->active_handles;
    puVar7 = puVar6;
    iVar1 = uv_pipe_init(puVar8,puVar6,0);
    iVar4 = (int)puVar7;
    if (iVar1 == 0) {
      puVar8 = puVar2;
      iVar1 = uv_accept();
      iVar4 = (int)puVar6;
      if (iVar1 == 0) {
        connection_cb_called = connection_cb_called + 1;
        if ((connection_cb_called == 4) && (connect_cb_called == 4)) {
          iVar1 = uv_stop(*(undefined8 *)&puVar2->active_handles);
          return iVar1;
        }
        return connection_cb_called;
      }
      goto LAB_00165423;
    }
  }
  else {
    connection_cb_cold_1();
    puVar8 = puVar2;
  }
  connection_cb_cold_2();
LAB_00165423:
  connection_cb_cold_3();
  if (iVar4 != 0) {
    connect_cb_cold_1();
    iVar1 = uv_is_closing();
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = uv_close(puVar8,0);
    return iVar1;
  }
  connect_cb_called = connect_cb_called + 1;
  if ((connect_cb_called == 4) && (connection_cb_called == 4)) {
    iVar1 = uv_stop(*(undefined8 *)((long)puVar8->pending_queue[0] + 8));
    return iVar1;
  }
  return connect_cb_called;
}

Assistant:

TEST_IMPL(pipe_connect_multiple) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  int i;
  int r;
  uv_loop_t* loop;

  loop = uv_default_loop();

  r = uv_pipe_init(loop, &server_handle, 0);
  ASSERT(r == 0);

  r = uv_pipe_bind(&server_handle, TEST_PIPENAME);
  ASSERT(r == 0);

  r = uv_listen((uv_stream_t*)&server_handle, 128, connection_cb);
  ASSERT(r == 0);

  for (i = 0; i < NUM_CLIENTS; i++) {
    r = uv_pipe_init(loop, &clients[i].pipe_handle, 0);
    ASSERT(r == 0);
    uv_pipe_connect(&clients[i].conn_req,
                    &clients[i].pipe_handle,
                    TEST_PIPENAME,
                    connect_cb);
  }

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(connection_cb_called == NUM_CLIENTS);
  ASSERT(connect_cb_called == NUM_CLIENTS);

  MAKE_VALGRIND_HAPPY();
  return 0;
}